

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_gettimeofday(uv_timeval64_t *tv)

{
  int iVar1;
  int *piVar2;
  undefined1 local_28 [8];
  timeval time;
  uv_timeval64_t *tv_local;
  
  if (tv == (uv_timeval64_t *)0x0) {
    tv_local._4_4_ = -0x16;
  }
  else {
    time.tv_usec = (__suseconds_t)tv;
    iVar1 = gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      *(undefined1 (*) [8])time.tv_usec = local_28;
      *(undefined4 *)(time.tv_usec + 8) = (undefined4)time.tv_sec;
      tv_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      tv_local._4_4_ = -*piVar2;
    }
  }
  return tv_local._4_4_;
}

Assistant:

int uv_gettimeofday(uv_timeval64_t* tv) {
  struct timeval time;

  if (tv == NULL)
    return UV_EINVAL;

  if (gettimeofday(&time, NULL) != 0)
    return UV__ERR(errno);

  tv->tv_sec = (int64_t) time.tv_sec;
  tv->tv_usec = (int32_t) time.tv_usec;
  return 0;
}